

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rnn.c
# Opt level: O2

void cleanuptypeinfo(rnntypeinfo *ti)

{
  int i;
  long lVar1;
  
  for (lVar1 = 0; lVar1 < ti->bitfieldsnum; lVar1 = lVar1 + 1) {
    freebitfield(ti->bitfields[lVar1]);
  }
  free(ti->bitfields);
  for (lVar1 = 0; lVar1 < ti->valsnum; lVar1 = lVar1 + 1) {
    freevalue(ti->vals[lVar1]);
  }
  free(ti->vals);
  free(ti->name);
  return;
}

Assistant:

static void cleanuptypeinfo(struct rnntypeinfo *ti) {
	int i;
	for (i = 0; i < ti->bitfieldsnum; i++)
		freebitfield(ti->bitfields[i]);
	free(ti->bitfields);

	for (i = 0; i < ti->valsnum; i++)
		freevalue(ti->vals[i]);
	free(ti->vals);

	free(ti->name);
}